

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

Sum * __thiscall
lossless_neural_sound::expression_compiler::expression::Nodes::
intern<lossless_neural_sound::expression_compiler::expression::Sum>
          (Nodes *this,Arena *arena,Sum *new_node)

{
  pointer ppNVar1;
  _func_int **pp_Var2;
  int iVar3;
  undefined4 extraout_var;
  Expression_node *node;
  ostream *poVar4;
  ulong uVar5;
  Node *pNVar6;
  undefined4 extraout_var_00;
  
  iVar3 = (*(new_node->
            super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
            super_Expression_node.super_Node._vptr_Node[2])(new_node);
  uVar5 = CONCAT44(extraout_var,iVar3) % 0x1fff;
  ppNVar1 = (this->hash_table).
            super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar6 = ppNVar1[uVar5];
  while( true ) {
    pp_Var2 = (new_node->
              super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>).
              super_Expression_node.super_Node._vptr_Node;
    if (pNVar6 == (Node *)0x0) {
      iVar3 = (*pp_Var2[5])(new_node,arena);
      node = (Expression_node *)CONCAT44(extraout_var_00,iVar3);
      (node->super_Node).hash_next = ppNVar1[uVar5];
      ppNVar1[uVar5] = (Node *)node;
      on_insert_node(this,node);
      uVar5 = this->node_count + 1;
      this->node_count = uVar5;
      if ((uVar5 & 0xfff) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"node_count = ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      return (Sum *)node;
    }
    iVar3 = (*pp_Var2[3])(new_node);
    if ((char)iVar3 != '\0') break;
    pNVar6 = ppNVar1[uVar5]->hash_next;
    ppNVar1[uVar5] = pNVar6;
  }
  return (Sum *)ppNVar1[uVar5];
}

Assistant:

const T *intern(Arena &arena, T &&new_node)
    {
        auto &&node_reference = to_node_reference(std::forward<T>(new_node));
        std::size_t hash = node_reference.hash();
        auto &table_entry = hash_table[hash % get_hash_table_size()];
        for(const Node **pnode = &table_entry; *pnode; *pnode = (*pnode)->hash_next)
        {
            if(node_reference.same(*pnode))
            {
                const Node *node = *pnode;
                if(node != table_entry)
                {
                    *pnode = node->hash_next;
                    node->hash_next = table_entry;
                    table_entry = node;
                }
                return static_cast<const T *>(node);
            }
        }
        const Node *node = std::forward<decltype(node_reference)>(node_reference).reallocate(arena);
        node->hash_next = table_entry;
        table_entry = node;
        auto retval = static_cast<const T *>(node);
        on_insert_node(retval);
        if(++node_count % 0x1000 == 0)
            std::cout << "node_count = " << node_count << std::endl;
        return retval;
    }